

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseLabelOpt(WastParser *this,string *out_label)

{
  TokenType TVar1;
  string_view local_88;
  string local_78;
  Token local_58;
  
  TVar1 = Peek(this,0);
  if (TVar1 == Last_String) {
    Consume(&local_58,this);
    if (5 < local_58.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/token.h"
                    ,0x62,"string_view wabt::Token::text() const");
    }
    local_88.data_ = local_58.field_2.text_.data_;
    local_88.size_ = local_58.field_2.text_.size_;
    string_view::to_string_abi_cxx11_(&local_78,&local_88);
    std::__cxx11::string::operator=((string *)out_label,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  else {
    out_label->_M_string_length = 0;
    *(out_label->_M_dataplus)._M_p = '\0';
  }
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseLabelOpt(std::string* out_label) {
  WABT_TRACE(ParseLabelOpt);
  if (PeekMatch(TokenType::Var)) {
    *out_label = Consume().text().to_string();
  } else {
    out_label->clear();
  }
  return Result::Ok;
}